

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O2

bool __thiscall STrdDisc::writeToFile(STrdDisc *this,FILE *ftrd)

{
  word *pwVar1;
  size_t sVar2;
  
  if (Options::IsBigEndian == '\x01') {
    pwVar1 = &this->numOfFreeSectors;
    *pwVar1 = *pwVar1 << 8 | *pwVar1 >> 8;
  }
  sVar2 = fwrite(this,0x100,1,(FILE *)ftrd);
  if ((sVar2 == 1) && (Options::IsBigEndian == '\x01')) {
    pwVar1 = &this->numOfFreeSectors;
    *pwVar1 = *pwVar1 << 8 | *pwVar1 >> 8;
  }
  return sVar2 == 1;
}

Assistant:

bool STrdDisc::writeToFile(FILE *ftrd) {
	if (Options::IsBigEndian) swapEndianness();		// fix endianness in binary form before write
	if (1 != fwrite(this, sizeof(STrdDisc), 1, ftrd)) return false;
	if (Options::IsBigEndian) swapEndianness();		// revert endianness back to native host form
	return true;
}